

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaPErr(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int error,char *msg,xmlChar *str1,
                  xmlChar *str2)

{
  void *local_70;
  void *data;
  xmlStructuredErrorFunc schannel;
  xmlGenericErrorFunc channel;
  xmlChar *str2_local;
  xmlChar *str1_local;
  char *msg_local;
  int error_local;
  xmlNodePtr node_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  schannel = (xmlStructuredErrorFunc)0x0;
  data = (void *)0x0;
  local_70 = (void *)0x0;
  if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
    ctxt->nberrors = ctxt->nberrors + 1;
    ctxt->err = error;
    schannel = (xmlStructuredErrorFunc)ctxt->error;
    local_70 = ctxt->errCtxt;
    data = ctxt->serror;
  }
  __xmlRaiseError((xmlStructuredErrorFunc)data,(xmlGenericErrorFunc)schannel,local_70,ctxt,node,0x10
                  ,error,XML_ERR_ERROR,(char *)0x0,0,(char *)str1,(char *)str2,(char *)0x0,0,0,msg,
                  str1,str2);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(4,0)
xmlSchemaPErr(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node, int error,
              const char *msg, const xmlChar * str1, const xmlChar * str2)
{
    xmlGenericErrorFunc channel = NULL;
    xmlStructuredErrorFunc schannel = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        ctxt->nberrors++;
	ctxt->err = error;
        channel = ctxt->error;
        data = ctxt->errCtxt;
	schannel = ctxt->serror;
    }